

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void __thiscall wallet::SQLiteCursor::~SQLiteCursor(SQLiteCursor *this)

{
  int iVar1;
  char (*args) [14];
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  char **args_1;
  
  args_1 = *(char ***)(in_FS_OFFSET + 0x28);
  (this->super_DatabaseCursor)._vptr_DatabaseCursor = (_func_int **)&PTR__SQLiteCursor_01155c90;
  sqlite3_clear_bindings(this->m_cursor_stmt);
  sqlite3_reset(this->m_cursor_stmt);
  iVar1 = sqlite3_finalize(this->m_cursor_stmt);
  if (iVar1 != 0) {
    args = (char (*) [14])sqlite3_errstr(iVar1);
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x5a;
    logging_function._M_str = "~SQLiteCursor";
    logging_function._M_len = 0xd;
    LogPrintf_<char[14],char_const*>
              (logging_function,source_file,0x24e,
               IPC|I2P|VALIDATION|LIBEVENT|CMPCTBLOCK|REINDEX|RPC|WALLETDB|NET,0xe218b3,
               &stack0xffffffffffffffe8,args,args_1);
  }
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&(this->m_prefix_range_end).super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&(this->m_prefix_range_start).super__Vector_base<std::byte,_std::allocator<std::byte>_>
            );
  if (*(char ***)(in_FS_OFFSET + 0x28) == args_1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLiteCursor::~SQLiteCursor()
{
    sqlite3_clear_bindings(m_cursor_stmt);
    sqlite3_reset(m_cursor_stmt);
    int res = sqlite3_finalize(m_cursor_stmt);
    if (res != SQLITE_OK) {
        LogPrintf("%s: cursor closed but could not finalize cursor statement: %s\n",
                  __func__, sqlite3_errstr(res));
    }
}